

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::SystemTools::EstimateFormatLength(char *format,__va_list_tag *ap)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 *local_50;
  char *s;
  char *cur;
  size_t length;
  __va_list_tag *ap_local;
  char *format_local;
  
  if (format == (char *)0x0) {
    format_local._4_4_ = 0;
  }
  else {
    cur = (char *)strlen(format);
    s = format;
    while (*s != '\0') {
      pcVar5 = s + 1;
      cVar1 = *s;
      s = pcVar5;
      if (cVar1 == '%') {
        if (*pcVar5 != '%') {
          while (iVar3 = isalpha((int)*s), iVar3 == 0) {
            s = s + 1;
          }
          if ((int)*s - 0x65U < 3) {
            cur = cur + 0x40;
            if (ap->fp_offset < 0xa1) {
              ap->fp_offset = ap->fp_offset + 0x10;
            }
            else {
              ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
            }
          }
          else if (*s == 0x73) {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_50 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_50 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_50 + 1;
            }
            if ((char *)*local_50 != (char *)0x0) {
              sVar4 = strlen((char *)*local_50);
              cur = cur + sVar4;
            }
          }
          else {
            cur = cur + 0x40;
            if (ap->gp_offset < 0x29) {
              ap->gp_offset = ap->gp_offset + 8;
            }
            else {
              ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
            }
          }
        }
        s = s + 1;
      }
    }
    format_local._4_4_ = (int)cur;
  }
  return format_local._4_4_;
}

Assistant:

int SystemTools::EstimateFormatLength(const char *format, va_list ap)
{
  if (!format)
    {
    return 0;
    }

  // Quick-hack attempt at estimating the length of the string.
  // Should never under-estimate.

  // Start with the length of the format string itself.

  size_t length = strlen(format);

  // Increase the length for every argument in the format.

  const char* cur = format;
  while(*cur)
    {
    if(*cur++ == '%')
      {
      // Skip "%%" since it doesn't correspond to a va_arg.
      if(*cur != '%')
        {
        while(!int(isalpha(*cur)))
          {
          ++cur;
          }
        switch (*cur)
          {
          case 's':
          {
          // Check the length of the string.
          char* s = va_arg(ap, char*);
          if(s)
            {
            length += strlen(s);
            }
          } break;
          case 'e':
          case 'f':
          case 'g':
          {
          // Assume the argument contributes no more than 64 characters.
          length += 64;

          // Eat the argument.
          static_cast<void>(va_arg(ap, double));
          } break;
          default:
          {
          // Assume the argument contributes no more than 64 characters.
          length += 64;

          // Eat the argument.
          static_cast<void>(va_arg(ap, int));
          } break;
          }
        }

      // Move past the characters just tested.
      ++cur;
      }
    }

  return static_cast<int>(length);
}